

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GLSLUtils.cpp
# Opt level: O2

void Diligent::GetGLSLVersion
               (ShaderCreateInfo *ShaderCI,TargetGLSLCompiler TargetCompiler,
               RENDER_DEVICE_TYPE DeviceType,RenderDeviceShaderVersionInfo *MaxShaderVersion,
               ShaderVersion *GLSLVer,bool *IsES)

{
  bool bVar1;
  uint uVar2;
  Version VVar3;
  ulong uVar4;
  uint uVar5;
  ShaderVersion SVar6;
  char (*in_stack_ffffffffffffffb8) [2];
  ShaderVersion CompilerVer;
  string _msg;
  
  *IsES = DeviceType == RENDER_DEVICE_TYPE_GLES;
  VVar3 = (&MaxShaderVersion->GLSL)[DeviceType == RENDER_DEVICE_TYPE_GLES];
  CompilerVer = VVar3;
  if (DeviceType == RENDER_DEVICE_TYPE_GLES && TargetCompiler == glslang) {
    bVar1 = (ulong)VVar3 >> 0x21 != 0;
    if (VVar3.Major != 3) {
      bVar1 = 3 < VVar3.Major;
    }
    CompilerVer.Major = 3;
    CompilerVer.Minor = 1;
    if (bVar1) {
      CompilerVer = VVar3;
    }
    VVar3 = (Version)((ulong)CompilerVer & 0xffffffff);
  }
  uVar4 = (ulong)CompilerVer >> 0x20;
  SVar6 = (&ShaderCI->GLSLVersion)[DeviceType == RENDER_DEVICE_TYPE_GLES];
  *GLSLVer = SVar6;
  uVar5 = SVar6.Major;
  uVar2 = VVar3.Major;
  if (uVar5 == 0 && (ulong)SVar6 >> 0x20 == 0) {
    SVar6 = CompilerVer;
    if ((uVar4 == 0 && uVar2 == 0) && (SVar6.Major = 4, SVar6.Minor = 3, *IsES == true)) {
      FormatString<char[26],char[6]>
                (&_msg,(Diligent *)"Debug expression failed:\n",(char (*) [26])"!IsES",
                 (char (*) [6])CONCAT71(CompilerVer._1_7_ >> 0x20,uVar4 != 0 || uVar2 != 0));
      DebugAssertionFailed
                (_msg._M_dataplus._M_p,"GetGLSLVersion",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/ShaderTools/src/GLSLUtils.cpp"
                 ,0x6e);
      std::__cxx11::string::~string((string *)&_msg);
    }
  }
  else {
    if (uVar4 == 0 && uVar2 == 0) {
      return;
    }
    bVar1 = CompilerVer.Minor < SVar6.Minor;
    if (uVar2 != uVar5) {
      bVar1 = uVar2 < uVar5;
    }
    if (!bVar1) {
      return;
    }
    FormatString<char[25],unsigned_int,char[2],unsigned_int,char[50],unsigned_int,char[2],unsigned_int,char[2]>
              (&_msg,(Diligent *)"Requested GLSL version (",(char (*) [25])GLSLVer,(uint *)0x7f04ea,
               (char (*) [2])&GLSLVer->Minor,
               (uint *)") is greater than the maximum supported version (",
               (char (*) [50])&CompilerVer,(uint *)0x7f04ea,(char (*) [2])&CompilerVer.Minor,
               (uint *)0x801c00,in_stack_ffffffffffffffb8);
    if (DebugMessageCallback != (undefined *)0x0) {
      (*(code *)DebugMessageCallback)(1,_msg._M_dataplus._M_p,0,0,0);
    }
    std::__cxx11::string::~string((string *)&_msg);
    SVar6 = CompilerVer;
  }
  GLSLVer->Major = SVar6.Major;
  GLSLVer->Minor = SVar6.Minor;
  return;
}

Assistant:

void GetGLSLVersion(const ShaderCreateInfo&              ShaderCI,
                    TargetGLSLCompiler                   TargetCompiler,
                    RENDER_DEVICE_TYPE                   DeviceType,
                    const RenderDeviceShaderVersionInfo& MaxShaderVersion,
                    ShaderVersion&                       GLSLVer,
                    bool&                                IsES)
{
    IsES = IsESSL(DeviceType);

    ShaderVersion CompilerVer = IsES ? MaxShaderVersion.GLESSL : MaxShaderVersion.GLSL;
    if (TargetCompiler == TargetGLSLCompiler::glslang)
    {
        if (IsES)
        {
            // glslang requires at least GLES3.1
            CompilerVer = ShaderVersion::Max(CompilerVer, ShaderVersion{3, 1});
        }
        else
        {
#if PLATFORM_APPLE
            CompilerVer = ShaderVersion{4, 3};
#endif
        }
    }

    GLSLVer = IsES ? ShaderCI.GLESSLVersion : ShaderCI.GLSLVersion;
    if (GLSLVer != ShaderVersion{})
    {
        if (CompilerVer != ShaderVersion{} && GLSLVer > CompilerVer)
        {
            LOG_WARNING_MESSAGE("Requested GLSL version (", GLSLVer.Major, ".", GLSLVer.Minor,
                                ") is greater than the maximum supported version (",
                                CompilerVer.Major, ".", CompilerVer.Minor, ")");
            GLSLVer = CompilerVer;
        }
    }
    else if (CompilerVer != ShaderVersion{})
    {
        GLSLVer = CompilerVer;
    }
    else
    {
#if PLATFORM_WIN32 || PLATFORM_LINUX
        {
            VERIFY_EXPR(!IsES);
            GLSLVer = {4, 3};
        }
#elif PLATFORM_MACOS
        {
            VERIFY_EXPR(!IsES);
            VERIFY_EXPR(TargetCompiler == TargetGLSLCompiler::driver);
            GLSLVer = {4, 1};
        }
#elif PLATFORM_ANDROID || PLATFORM_IOS || PLATFORM_TVOS || PLATFORM_WEB
        {
            VERIFY_EXPR(IsES);
            if (DeviceType == RENDER_DEVICE_TYPE_VULKAN || DeviceType == RENDER_DEVICE_TYPE_METAL)
            {
                GLSLVer = {3, 1};
            }
            else if (DeviceType == RENDER_DEVICE_TYPE_GLES)
            {
                GLSLVer = {3, 0};
            }
            else
            {
                UNEXPECTED("Unexpected device type");
            }
        }
#else
#    error Unknown platform
#endif
    }
}